

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

void __thiscall ON_SubDHeap::ReturnArray(ON_SubDHeap *this,size_t capacity,ON__UINT_PTR *a)

{
  ON__UINT_PTR OVar1;
  ON__UINT_PTR *a_local;
  size_t capacity_local;
  ON_SubDHeap *this_local;
  
  if ((a != (ON__UINT_PTR *)0x0) && (capacity == 0)) {
    ON_SubDIncrementErrorCount();
  }
  OVar1 = ArrayCapacity(capacity,a);
  switch(OVar1) {
  case 0:
    break;
  default:
    ReturnOversizedElement(this,capacity,a);
    break;
  case 4:
    ON_FixedSizePool::ReturnElement(&this->m_fsp5,a + -1);
    break;
  case 8:
    ON_FixedSizePool::ReturnElement(&this->m_fsp9,a + -1);
    break;
  case 0x10:
    ON_FixedSizePool::ReturnElement(&this->m_fsp17,a + -1);
  }
  return;
}

Assistant:

void ON_SubDHeap::ReturnArray(
  size_t capacity,
  ON__UINT_PTR* a
  )
{
  if (nullptr != a && 0 == capacity)
  {
    ON_SubDIncrementErrorCount();
  }

  switch (ON_SubDHeap::ArrayCapacity(capacity,a))
  {
  case 0:
    break;
  case 4:
    m_fsp5.ReturnElement(a - 1);
    break;
  case 8:
    m_fsp9.ReturnElement(a - 1);
    break;
  case 16:
    m_fsp17.ReturnElement(a - 1);
    break;
  default:
    ReturnOversizedElement(capacity,a);
    break;
  }
  return;
}